

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O1

Error * ot::commissioner::internal::DecodeModeData
                  (Error *__return_storage_ptr__,ModeData *aModeData,ByteArray *aBuf)

{
  byte *pbVar1;
  char *pcVar2;
  long lVar3;
  char *to;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *from;
  bool bVar4;
  string_view fmt;
  format_args args;
  writer write;
  string local_b8;
  writer local_98;
  ErrorCode local_90;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  format_string_checker<char> local_68;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  pbVar1 = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pbVar1;
  if (lVar3 == 1) {
    aModeData->mIsRxOnWhenIdleMode = (bool)(*pbVar1 & 1);
    aModeData->mIsMtd = (*pbVar1 & 2) == 0;
    aModeData->mIsStableNetworkDataRequired = (bool)(*pbVar1 >> 2 & 1);
  }
  else {
    local_68.types_[0] = ulong_long_type;
    from = "invalid Mode value length {}, expect 1";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "invalid Mode value length {}, expect 1";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x26;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 1;
    local_68.parse_funcs_[0] =
         ::fmt::v10::detail::
         parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
    local_98.handler_ = &local_68;
    local_68.context_.types_ = local_68.types_;
    do {
      if (from == "") break;
      to = from;
      if (*from == '{') {
LAB_001a5809:
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_long>_>
        ::writer::operator()(&local_98,from,to);
        from = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_long>&>
                         (to,"",&local_68);
        bVar4 = true;
      }
      else {
        to = from + 1;
        bVar4 = to != "";
        if (bVar4) {
          if (*to != '{') {
            pcVar2 = from + 2;
            do {
              to = pcVar2;
              bVar4 = to != "";
              if (to == "") goto LAB_001a5805;
              pcVar2 = to + 1;
            } while (*to != '{');
          }
          bVar4 = true;
        }
LAB_001a5805:
        if (bVar4) goto LAB_001a5809;
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_long>_>
        ::writer::operator()(&local_98,from,"");
        bVar4 = false;
      }
    } while (bVar4);
    fmt.size_ = 4;
    fmt.data_ = (char *)0x26;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_68;
    local_68._0_8_ = lVar3;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_b8,(v10 *)"invalid Mode value length {}, expect 1",fmt,args);
    local_90 = kBadFormat;
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,local_b8._M_dataplus._M_p,
               local_b8._M_dataplus._M_p + local_b8._M_string_length);
    __return_storage_ptr__->mCode = local_90;
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_88);
    if (local_88[0] != local_78) {
      operator_delete(local_88[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error internal::DecodeModeData(ModeData &aModeData, const ByteArray &aBuf)
{
    Error  error;
    size_t length = aBuf.size();
    VerifyOrExit(length == 1, error = ERROR_BAD_FORMAT("invalid Mode value length {}, expect 1", length));
    aModeData.mIsRxOnWhenIdleMode          = (aBuf[0] & 0x01) != 0;
    aModeData.mIsMtd                       = (aBuf[0] & 0x02) == 0;
    aModeData.mIsStableNetworkDataRequired = (aBuf[0] & 0x04) != 0;

exit:
    return error;
}